

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

void jinit_arith_decoder(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  int (*paiVar2) [64];
  int iVar3;
  long lVar4;
  
  pjVar1 = (jpeg_entropy_decoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x158);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass;
  for (lVar4 = -0x80; lVar4 != 0; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)&pjVar1[8].insufficient_data + lVar4) = 0;
    *(undefined8 *)((long)&pjVar1[0xe].start_pass + lVar4) = 0;
  }
  *(undefined1 *)&pjVar1[0xe].start_pass = 0x71;
  if (cinfo->progressive_mode != 0) {
    paiVar2 = (int (*) [64])
              (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components << 9);
    cinfo->coef_bits = paiVar2;
    for (iVar3 = 0; iVar3 < cinfo->num_components; iVar3 = iVar3 + 1) {
      for (lVar4 = 0; (int)lVar4 != 0x100; lVar4 = lVar4 + 4) {
        *(undefined4 *)((long)*paiVar2 + lVar4) = 0xffffffff;
      }
      paiVar2 = (int (*) [64])((long)*paiVar2 + lVar4);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_arith_decoder(j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy;
  int i;

  entropy = (arith_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(arith_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *)entropy;
  entropy->pub.start_pass = start_pass;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    entropy->dc_stats[i] = NULL;
    entropy->ac_stats[i] = NULL;
  }

  /* Initialize index for fixed probability estimation */
  entropy->fixed_bin[0] = 113;

  if (cinfo->progressive_mode) {
    /* Create progression status table */
    int *coef_bit_ptr, ci;
    cinfo->coef_bits = (int (*)[DCTSIZE2])
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  cinfo->num_components * 2 * DCTSIZE2 *
                                  sizeof(int));
    coef_bit_ptr = &cinfo->coef_bits[0][0];
    for (ci = 0; ci < cinfo->num_components; ci++)
      for (i = 0; i < DCTSIZE2; i++)
        *coef_bit_ptr++ = -1;
  }
}